

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpbyepacket.h
# Opt level: O2

uint8_t * __thiscall jrtplib::RTCPBYEPacket::GetReasonData(RTCPBYEPacket *this)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  
  if (((this->super_RTCPPacket).knownformat == true) && (this->reasonoffset != 0)) {
    puVar2 = (this->super_RTCPPacket).data + this->reasonoffset;
    puVar1 = (uint8_t *)0x0;
    if (*puVar2 != '\0') {
      puVar1 = puVar2 + 1;
    }
    return puVar1;
  }
  return (uint8_t *)0x0;
}

Assistant:

inline uint8_t *RTCPBYEPacket::GetReasonData()
{
	if (!knownformat)
		return 0;
	if (reasonoffset == 0)
		return 0;
	uint8_t *reasonlen = (data+reasonoffset);
	if ((*reasonlen) == 0)
		return 0;
	return (data+reasonoffset+1);	
}